

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Iterator * __thiscall
leveldb::TableCache::NewIterator
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,
          Table **tableptr)

{
  long lVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  Iterator *pIVar4;
  void *arg2;
  Handle **in_RSI;
  uint64_t in_RDI;
  undefined8 *in_R8;
  long in_FS_OFFSET;
  Iterator *result;
  Table *table;
  Status s;
  Handle *handle;
  Status *in_stack_ffffffffffffff58;
  ReadOptions *in_stack_ffffffffffffff60;
  Table *in_stack_ffffffffffffff68;
  Status *in_stack_ffffffffffffff78;
  CleanupFunction func;
  undefined7 in_stack_ffffffffffffff88;
  uint64_t in_stack_ffffffffffffffe0;
  TableCache *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  func = (CleanupFunction)&stack0xffffffffffffffe8;
  FindTable(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_RDI,in_RSI);
  uVar3 = Status::ok(in_stack_ffffffffffffff58);
  if ((bool)uVar3) {
    arg2 = (void *)(**(code **)(**(long **)(in_RDI + 0x30) + 0x28))(*(long **)(in_RDI + 0x30),0);
    uVar2 = *(undefined8 *)((long)arg2 + 8);
    pIVar4 = Table::NewIterator(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    Iterator::RegisterCleanup
              ((Iterator *)CONCAT17(uVar3,in_stack_ffffffffffffff88),func,in_stack_ffffffffffffff78,
               arg2);
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = uVar2;
    }
  }
  else {
    pIVar4 = NewErrorIterator(in_stack_ffffffffffffff78);
  }
  Status::~Status(in_stack_ffffffffffffff58);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pIVar4;
}

Assistant:

Iterator* TableCache::NewIterator(const ReadOptions& options,
                                  uint64_t file_number, uint64_t file_size,
                                  Table** tableptr) {
  if (tableptr != nullptr) {
    *tableptr = nullptr;
  }

  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (!s.ok()) {
    return NewErrorIterator(s);
  }

  Table* table = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
  Iterator* result = table->NewIterator(options);
  result->RegisterCleanup(&UnrefEntry, cache_, handle);
  if (tableptr != nullptr) {
    *tableptr = table;
  }
  return result;
}